

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydata.cpp
# Opt level: O0

void QArrayData::deallocate(QArrayData *data,qsizetype objectSize,qsizetype alignment)

{
  long lVar1;
  void *ptr;
  qsizetype in_RDX;
  void *in_RDI;
  long in_FS_OFFSET;
  CalculateGrowingBlockSizeResult CVar2;
  qsizetype allocSize;
  qsizetype headerSize;
  qsizetype capacity;
  CalculateGrowingBlockSizeResult blockSize;
  undefined8 in_stack_ffffffffffffffb8;
  AllocationOption option;
  qsizetype objectSize_00;
  undefined8 local_18;
  
  option = (AllocationOption)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  objectSize_00 = *(qsizetype *)((long)in_RDI + 8);
  ptr = (void *)calculateHeaderSize(in_RDX);
  CVar2 = calculateBlockSize(in_RDX,objectSize_00,(qsizetype)ptr,option);
  local_18 = CVar2.size;
  if ((long)local_18 < 1) {
    free(in_RDI);
  }
  else {
    QtPrivate::sizedFree(ptr,local_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QArrayData::deallocate(QArrayData *data, qsizetype objectSize,
        qsizetype alignment) noexcept
{
    // Alignment is a power of two
    Q_ASSERT(alignment >= qsizetype(alignof(QArrayData))
            && !(alignment & (alignment - 1)));

    const qsizetype capacity = data->alloc;
    const qsizetype headerSize = calculateHeaderSize(alignment);
    Q_ASSERT(headerSize > 0);
    const auto blockSize = calculateBlockSize(capacity, objectSize,
                                              headerSize, QArrayData::KeepSize);
    const qsizetype allocSize = blockSize.size;

    if (Q_LIKELY(allocSize > 0))
        QtPrivate::sizedFree(data, size_t(allocSize));
    else // something went wrong, fallback to slow free()
        free(data);
}